

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Object do_search_dir(Am_Which_Search_Direction dir,Am_Value_List *parts,
                       Am_Value_List *old_sel_list,Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  ostream *poVar8;
  void *this;
  undefined4 in_register_0000003c;
  Am_Object_Data *this_00;
  Am_Value_List *in_R8;
  Am_Object local_88;
  Am_Object cur_target_object;
  int local_78;
  int target_max_amount;
  int target_min_amount;
  Am_Object local_68;
  Am_Object object;
  int this_r;
  int this_b;
  int this_t;
  int this_l;
  int min_b;
  int max_t;
  int max_r;
  int min_l;
  int max_b;
  int min_t;
  int min_r;
  int max_l;
  Am_Value_List *slots_and_values_used_local;
  Am_Value_List *old_sel_list_local;
  Am_Value_List *parts_local;
  Am_Which_Search_Direction dir_local;
  
  this_00 = (Am_Object_Data *)CONCAT44(in_register_0000003c,dir);
  iVar2 = (int)parts;
  min_t = -32000;
  max_b = 32000;
  min_l = 32000;
  max_r = -32000;
  max_t = 32000;
  min_b = -32000;
  this_l = -32000;
  this_t = 32000;
  Am_Object::Am_Object(&local_68);
  bVar1 = Am_Value_List::Valid(slots_and_values_used);
  if (bVar1) {
    Am_Value_List::Start(slots_and_values_used);
    while (bVar1 = Am_Value_List::Last(slots_and_values_used), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar6 = Am_Value_List::Get(slots_and_values_used);
      Am_Object::operator=(&local_68,pAVar6);
      pAVar6 = Am_Object::Get(&local_68,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&local_68,0x65,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&local_68,0x66,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      object.data._0_4_ = iVar3 + -1 + iVar5;
      pAVar6 = Am_Object::Get(&local_68,0x67,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      object.data._4_4_ = iVar4 + iVar5 + -1;
      if (min_t < iVar3) {
        min_t = iVar3;
      }
      if (iVar4 < min_l) {
        min_l = iVar4;
      }
      if (max_r < object.data._4_4_) {
        max_r = object.data._4_4_;
      }
      if ((int)object.data < max_b) {
        max_b = (int)object.data;
      }
      if (iVar3 < max_t) {
        max_t = iVar3;
      }
      if (this_l < iVar4) {
        this_l = iVar4;
      }
      if (object.data._4_4_ < this_t) {
        this_t = object.data._4_4_;
      }
      if (min_b < (int)object.data) {
        min_b = (int)object.data;
      }
      Am_Value_List::Next(slots_and_values_used);
    }
  }
  else {
    max_t = -32000;
    min_t = -32000;
    this_l = -32000;
    min_l = -32000;
    max_b = 32000;
    min_b = 32000;
    this_t = 32000;
    max_r = 32000;
  }
  local_78 = 32000;
  cur_target_object.data._4_4_ = 0;
  Am_Object::Am_Object(&local_88);
  if (iVar2 == 8) {
    Am_Value_List::End(old_sel_list);
    while (bVar1 = Am_Value_List::First(old_sel_list), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar6 = Am_Value_List::Get(old_sel_list);
      Am_Object::operator=(&local_68,pAVar6);
      pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
      bVar1 = Am_Value_List::Start_Member(slots_and_values_used,pAVar7);
      if ((!bVar1) && (bVar1 = test_match_object(&local_68,in_R8), bVar1)) {
        pAVar6 = Am_Object::Get(&local_68,100,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = Am_Object::Get(&local_68,0x65,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = Am_Object::Get(&local_68,0x66,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        object.data._0_4_ = iVar2 + -1 + iVar4;
        pAVar6 = Am_Object::Get(&local_68,0x67,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        object.data._4_4_ = iVar3 + iVar4 + -1;
        if ((iVar2 <= max_t) &&
           (((iVar3 <= min_l && (max_r <= object.data._4_4_)) && (min_b <= (int)object.data)))) {
          Am_Object::Am_Object((Am_Object *)this_00,&local_68);
          goto LAB_002cb33b;
        }
      }
      Am_Value_List::Prev(old_sel_list);
    }
  }
  else {
    Am_Value_List::Start(old_sel_list);
    while (bVar1 = Am_Value_List::Last(old_sel_list), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar6 = Am_Value_List::Get(old_sel_list);
      Am_Object::operator=(&local_68,pAVar6);
      pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
      bVar1 = Am_Value_List::Start_Member(slots_and_values_used,pAVar7);
      if ((!bVar1) && (bVar1 = test_match_object(&local_68,in_R8), bVar1)) {
        pAVar6 = Am_Object::Get(&local_68,100,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = Am_Object::Get(&local_68,0x65,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar6);
        pAVar6 = Am_Object::Get(&local_68,0x66,0);
        iVar5 = Am_Value::operator_cast_to_int(pAVar6);
        object.data._0_4_ = iVar3 + -1 + iVar5;
        pAVar6 = Am_Object::Get(&local_68,0x67,0);
        iVar5 = Am_Value::operator_cast_to_int(pAVar6);
        object.data._4_4_ = iVar4 + -1 + iVar5;
        switch(iVar2) {
        case 3:
          if (((object.data._4_4_ <= this_t) && (cur_target_object.data._4_4_ < object.data._4_4_))
             && ((max_t <= (int)object.data && (iVar3 <= min_b)))) {
            cur_target_object.data._4_4_ = object.data._4_4_;
            Am_Object::operator=(&local_88,&local_68);
          }
          break;
        case 4:
          if ((((this_l <= iVar4) && (iVar4 < local_78)) && (max_t <= (int)object.data)) &&
             (iVar3 <= min_b)) {
            Am_Object::operator=(&local_88,&local_68);
            local_78 = iVar4;
          }
          break;
        case 5:
          if ((((int)object.data <= max_b) && (cur_target_object.data._4_4_ < (int)object.data)) &&
             ((min_l <= object.data._4_4_ && (iVar4 <= max_r)))) {
            cur_target_object.data._4_4_ = (int)object.data;
            Am_Object::operator=(&local_88,&local_68);
          }
          break;
        case 6:
          if (((min_t <= iVar3) && (iVar3 < local_78)) &&
             ((min_l <= object.data._4_4_ && (iVar4 <= max_r)))) {
            Am_Object::operator=(&local_88,&local_68);
            local_78 = iVar3;
          }
          break;
        case 7:
          if ((((max_t <= iVar3) && (min_l <= iVar4)) && (object.data._4_4_ <= max_r)) &&
             ((int)object.data <= min_b)) {
            Am_Object::Am_Object((Am_Object *)this_00,&local_68);
            goto LAB_002cb33b;
          }
          break;
        default:
          poVar8 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar8 = std::operator<<(poVar8,"Bad dir ");
          this = (void *)std::ostream::operator<<(poVar8,iVar2);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
      }
      Am_Value_List::Next(old_sel_list);
    }
  }
  Am_Object::Am_Object((Am_Object *)this_00,&local_88);
LAB_002cb33b:
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_68);
  return (Am_Object)this_00;
}

Assistant:

Am_Object
do_search_dir(Am_Which_Search_Direction dir, Am_Value_List &parts,
              Am_Value_List &old_sel_list, Am_Value_List &slots_and_values_used)
{

  //compute the starting positions
  int max_l = -32000;
  int min_r = 32000;
  int min_t = 32000;
  int max_b = -32000;

  int min_l = 32000;
  int max_r = -32000;
  int max_t = -32000;
  int min_b = 32000;
  int this_l, this_t, this_b, this_r;
  Am_Object object;
  if (old_sel_list.Valid()) {
    for (old_sel_list.Start(); !old_sel_list.Last(); old_sel_list.Next()) {
      object = old_sel_list.Get();
      this_l = object.Get(Am_LEFT);
      this_t = object.Get(Am_TOP);
      this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
      this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
      if (this_l > max_l)
        max_l = this_l;
      if (this_t < min_t)
        min_t = this_t;
      if (this_b > max_b)
        max_b = this_b;
      if (this_r < min_r)
        min_r = this_r;
      if (this_l < min_l)
        min_l = this_l;
      if (this_t > max_t)
        max_t = this_t;
      if (this_b < min_b)
        min_b = this_b;
      if (this_r > max_r)
        max_r = this_r;
    }
  } else { //if no objects, set edge values
    min_l = -32000;
    max_l = -32000;
    max_t = -32000;
    min_t = -32000;
    min_r = 32000;
    max_r = 32000;
    min_b = 32000;
    max_b = 32000;
  }
  //now search forward for new object
  int target_min_amount = 32000;
  int target_max_amount = 0;
  Am_Object cur_target_object;

  if (dir == Am_Search_Out) { //have to go in opposite order
    for (parts.End(); !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (!old_sel_list.Start_Member(object) &&
          test_match_object(object, slots_and_values_used)) {
        this_l = object.Get(Am_LEFT);
        this_t = object.Get(Am_TOP);
        this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
        this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
        if (this_l <= min_l && this_t <= min_t && this_b >= max_b &&
            this_r >= max_r) {
          return object;
        }
      }
    }
  } else {
    for (parts.Start(); !parts.Last(); parts.Next()) {
      object = parts.Get();
      if (!old_sel_list.Start_Member(object) &&
          test_match_object(object, slots_and_values_used)) {
        this_l = object.Get(Am_LEFT);
        this_t = object.Get(Am_TOP);
        this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
        this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
        switch (dir) {
        case Am_Search_Up:
          if (this_b <= min_b && this_b > target_max_amount &&
              this_r >= min_l && this_l <= max_r) {
            target_max_amount = this_b;
            cur_target_object = object;
          }
          break;
        case Am_Search_Down:
          if (this_t >= max_t && this_t < target_min_amount &&
              this_r >= min_l && this_l <= max_r) {
            target_min_amount = this_t;
            cur_target_object = object;
          }
          break;
        case Am_Search_Left:
          if (this_r <= min_r && this_r > target_max_amount &&
              this_b >= min_t && this_t <= max_b) {
            target_max_amount = this_r;
            cur_target_object = object;
          }
          break;
        case Am_Search_Right:
          if (this_l >= max_l && this_l < target_min_amount &&
              this_b >= min_t && this_t <= max_b) {
            target_min_amount = this_l;
            cur_target_object = object;
          }
          break;
        case Am_Search_In:
          if (this_l >= min_l && this_t >= min_t && this_b <= max_b &&
              this_r <= max_r) {
            return object;
          }
          break;
        default:
          Am_ERROR("Bad dir " << (int)dir);
        }
      }
    }
  }
  return cur_target_object;
}